

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall Units_construct_Test::~Units_construct_Test(Units_construct_Test *this)

{
  Units_construct_Test *this_local;
  
  ~Units_construct_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, construct)
{
    libcellml::UnitsPtr u = libcellml::Units::create();
    u->setName("valid_name");
    EXPECT_EQ("valid_name", u->name());

    const std::string validName = "another_valid_name";
    auto u2 = libcellml::Units::create(validName);
    EXPECT_EQ("another_valid_name", u2->name());
}